

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::Print(TPZMHMixedMeshControl *this,ostream *out)

{
  TPZReference *pTVar1;
  TPZGeoMesh *pTVar2;
  TPZReference *pTVar3;
  TPZCompMesh *pTVar4;
  bool bVar5;
  long *plVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Self __tmp;
  ulong uVar9;
  _Self __tmp_1;
  
  pTVar1 = (this->super_TPZMHMeshControl).fGMesh.fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZGeoMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* GEOMETRIC MESH *****************\n",0x35);
    pTVar2 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
    (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[9])(pTVar2,out);
  }
  pTVar3 = (this->fFluxMesh).fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* FLUX MESH *****************\n",0x30);
    pTVar4 = ((this->fFluxMesh).fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fPressureFineMesh.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* PRESSURE MESH *****************\n",0x34);
    pTVar4 = ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMesh.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* COMPUTATIONAL MESH *****************\n",0x39);
    pTVar4 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMeshLagrange.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* LAGRANGE MULTIPLIER MESH *****************\n",0x3f);
    pTVar4 = ((this->super_TPZMHMeshControl).fCMeshLagrange.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  pTVar3 = (this->super_TPZMHMeshControl).fCMeshConstantPressure.fRef;
  if ((pTVar3 != (TPZReference *)0x0) && (pTVar3->fPointer != (TPZCompMesh *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"******************* CONSTANTE PRESSURE MESH *****************\n",0x3e);
    pTVar4 = ((this->super_TPZMHMeshControl).fCMeshConstantPressure.fRef)->fPointer;
    (**(code **)(*(long *)pTVar4 + 0x68))(pTVar4,out);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Skeleton Mat Id ",0x10);
  plVar6 = (long *)std::ostream::operator<<(out,(this->super_TPZMHMeshControl).fSkeletonMatId);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Lagrange mat id left - right ",0x1d);
  poVar7 = (ostream *)
           std::ostream::operator<<(out,(this->super_TPZMHMeshControl).fLagrangeMatIdLeft);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
  plVar6 = (long *)std::ostream::operator<<
                             (poVar7,(this->super_TPZMHMeshControl).fLagrangeMatIdRight);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Internal polynomial order ",0x1a);
  plVar6 = (long *)std::ostream::operator<<(out,(this->super_TPZMHMeshControl).fpOrderInternal);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Skeleton polynomial order ",0x1a);
  plVar6 = (long *)std::ostream::operator<<(out,(this->super_TPZMHMeshControl).fpOrderSkeleton);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Geometric element indices of the coarse mesh ",0x2d);
  for (p_Var8 = (this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->super_TPZMHMeshControl).fMHMtoSubCMesh._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    poVar7 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  }
  bVar5 = SUB81(out,0);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + bVar5);
  std::ostream::put(bVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Skeleton element indices with associated left and right coarse element indices\n",
             0x4f);
  for (p_Var8 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"skel index ",0xb);
    poVar7 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Left Right indices ",0x14);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Will generate a constant pressure mesh ",0x27);
  poVar7 = std::ostream::_M_insert<bool>(bVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Subdomain indices of the connects by mesh\n",0x2a);
  for (p_Var8 = (this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->super_TPZMHMeshControl).fConnectToSubDomainIdentifier._M_t._M_impl.
       super__Rb_tree_header; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Computational mesh pointer ",0x1b);
    poVar7 = std::ostream::_M_insert<void_const*>(out);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (0 < (long)p_Var8[1]._M_right) {
      uVar9 = 0;
      do {
        if ((uVar9 != 0) && ((uVar9 / 5 & 0xfffffffffffffffc) * 5 == uVar9)) {
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + bVar5);
          std::ostream::put(bVar5);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
        poVar7 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"->",2);
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)p_Var8[1]._M_right);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + bVar5);
    std::ostream::put(bVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::Print(std::ostream &out)
{
    
    /// geometric mesh used to create the computational mesh
    if (fGMesh)
    {
        out << "******************* GEOMETRIC MESH *****************\n";
        fGMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fFluxMesh)
    {
        out << "******************* FLUX MESH *****************\n";
        fFluxMesh->Print(out);
    }
    
    /// computational mesh to contain the pressure elements
    // this mesh is the same as fCMesh if there are no lagrange multipliers assocated with the average pressure
    if (fPressureFineMesh)
    {
        out << "******************* PRESSURE MESH *****************\n";
        fPressureFineMesh->Print(out);
    }
    
    
    /// computational MHM mesh being built by this class
    if (fCMesh)
    {
        out << "******************* COMPUTATIONAL MESH *****************\n";
        fCMesh->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshLagrange)
    {
        out << "******************* LAGRANGE MULTIPLIER MESH *****************\n";
        fCMeshLagrange->Print(out);
    }
    
    /// computational mesh to represent the constant states
    if (fCMeshConstantPressure)
    {
        out << "******************* CONSTANTE PRESSURE MESH *****************\n";
        fCMeshConstantPressure->Print(out);
    }
    
    /// material id associated with the skeleton elements
    out << "Skeleton Mat Id " <<  fSkeletonMatId << std::endl;
    
    /// material id associated with the lagrange multiplier elements
    out << "Lagrange mat id left - right " <<  fLagrangeMatIdLeft << " - " << fLagrangeMatIdRight << std::endl;
    
    /// interpolation order of the internal elements
    out << "Internal polynomial order " <<  fpOrderInternal << std::endl;
    
    /// interpolation order of the skeleton elements
    out << "Skeleton polynomial order " << fpOrderSkeleton << std::endl;
    
    /// indices of the geometric elements which define the skeleton mesh
    {
        out << "Geometric element indices of the coarse mesh ";
        for (std::map<int64_t,int64_t>::iterator it= fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            out << it->first << " " << it->second << " ";
        }
        out << std::endl;
    }
    /// indices of the skeleton elements and their left/right elements of the skeleton mesh
    out << "Skeleton element indices with associated left and right coarse element indices\n";
    {
        std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
        for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
            out << "skel index " << it->first << " Left Right indices " << it->second.first << " " << it->second.second << std::endl;
        }
    }
    
    /// flag to determine whether a lagrange multiplier is included to force zero average pressures in the subdomains
    /**
     * when imposing average pressure to be zero, a multiphysics mesh is created
     */
    out << "Will generate a constant pressure mesh " <<  fLagrangeAveragePressure << std::endl;
    /// subdonain indices of the connects
    out << "Subdomain indices of the connects by mesh\n";
    for (auto it = fConnectToSubDomainIdentifier.begin(); it != fConnectToSubDomainIdentifier.end(); it++) {
        TPZCompMesh *cmesh = it->first;
        TPZManVector<int64_t> &cvec = it->second;
        out << "Computational mesh pointer " << (void *) cmesh << std::endl;
        for (int64_t i=0; i<cvec.size(); i++) {
            if (i && !(i%20)) {
                out << std::endl;
            }
            out << "(" << i << "->" << cvec[i] << ") ";
        }
        out << std::endl;
    }
    
}